

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O1

wchar_t CVmFormatter::next_wchar(char **s,size_t *len)

{
  wchar_t wVar1;
  wchar_t wVar2;
  uint ch;
  long lVar3;
  
  if (*len != 0) {
    wVar1 = utf8_ptr::s_getch(*s);
    lVar3 = (ulong)((((byte)**s >> 5 & 1) != 0) + 1 & (uint)((byte)**s >> 7) * 3) + 1;
    *len = *len - lVar3;
    *s = *s + lVar3;
    wVar2 = L' ';
    if (wVar1 != L'\0') {
      wVar2 = wVar1;
    }
    return wVar2;
  }
  return L'\0';
}

Assistant:

wchar_t CVmFormatter::next_wchar(const char **s, size_t *len)
{
    wchar_t ret;
    size_t charsize;

    /* if there's nothing left, return a null terminator */
    if (*len == 0)
        return 0;

    /* get this character */
    ret = utf8_ptr::s_getch(*s);

    /* advance the string pointer and length counter */
    charsize = utf8_ptr::s_charsize(**s);
    *len -= charsize;
    *s += charsize;

    /* render embedded null bytes as spaces */
    if (ret == 0)
        ret = ' ';

    /* return the result */
    return ret;
}